

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O3

void __thiscall leveldb::MemTableIterator::~MemTableIterator(MemTableIterator *this)

{
  pointer pcVar1;
  
  (this->super_Iterator)._vptr_Iterator = (_func_int **)&PTR__MemTableIterator_00132270;
  pcVar1 = (this->tmp_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->tmp_).field_2) {
    operator_delete(pcVar1);
  }
  Iterator::~Iterator(&this->super_Iterator);
  operator_delete(this);
  return;
}

Assistant:

explicit MemTableIterator(MemTable::Table *table) : iter_(table) {}